

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnExpr(BinaryReaderInterp *this)

{
  Result RVar1;
  Enum EVar2;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc;
  u32 local_44;
  u32 local_40;
  u32 local_3c;
  Location local_38;
  
  RVar1 = GetReturnDropKeepCount(this,&local_3c,&local_40);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = TypeChecker::GetCatchCount
                      (&(this->validator_).typechecker_,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &local_44);
    if (RVar1.enum_ != Error) {
      local_38.field_1.field_0.last_column = 0;
      local_38.filename._M_len = (this->filename_)._M_len;
      local_38.filename._M_str = (this->filename_)._M_str;
      local_38.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      RVar1 = SharedValidator::OnReturn(&this->validator_,&local_38);
      if (RVar1.enum_ != Error) {
        Istream::EmitDropKeep(this->istream_,local_3c,local_40);
        Istream::EmitCatchDrop(this->istream_,local_44);
        Istream::Emit(this->istream_,Return);
        EVar2 = Ok;
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnReturnExpr() {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  CHECK_RESULT(validator_.OnReturn(GetLocation()));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  istream_.Emit(Opcode::Return);
  return Result::Ok;
}